

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  U32 lowestValid;
  ulong *puVar9;
  ulong *puVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  ulong *puVar16;
  long lVar17;
  int iVar18;
  BYTE *pBVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  BYTE *litEnd;
  ulong *puVar27;
  ulong *puVar28;
  ulong *puVar29;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_d0;
  uint local_c8;
  uint local_c4;
  ulong *local_c0;
  uint local_b4;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  seqStore_t *local_a0;
  BYTE *local_98;
  ZSTD_matchState_t *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_98 = (ms->window).base;
  uVar13 = (ms->window).dictLimit;
  local_40 = local_98 + uVar13;
  uVar25 = (ms->cParams).minMatch;
  if (5 < uVar25) {
    uVar25 = 6;
  }
  if (uVar25 < 5) {
    uVar25 = 4;
  }
  local_a4 = (ms->cParams).searchLog;
  local_c8 = 6;
  if (local_a4 < 6) {
    local_c8 = local_a4;
  }
  if (local_c8 < 5) {
    local_c8 = 4;
  }
  puVar27 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar18 = (int)puVar27 - (int)local_98;
  local_58 = *rep;
  local_54 = iVar18 - uVar23;
  if (iVar18 - uVar13 <= uVar23) {
    local_54 = uVar13;
  }
  uVar23 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar13;
  }
  local_5c = rep[1];
  local_54 = iVar18 - local_54;
  local_a8 = local_5c;
  if (local_54 < local_5c) {
    local_a8 = uVar23;
  }
  local_b4 = local_58;
  if (local_54 < local_58) {
    local_b4 = uVar23;
  }
  ms->lazySkipping = 0;
  local_88 = (ulong *)((long)src + (srcSize - 0x10));
  uVar13 = ms->nextToUpdate;
  uVar20 = (ulong)uVar13;
  uVar15 = ((int)local_88 - (int)(local_98 + uVar20)) + 1;
  uVar12 = 8;
  if (uVar15 < 8) {
    uVar12 = uVar15;
  }
  if (local_88 < local_98 + uVar20) {
    uVar12 = uVar23;
  }
  bVar11 = (byte)local_c8;
  local_c4 = uVar25;
  local_a0 = seqStore;
  local_90 = ms;
  local_48 = rep;
  if (uVar13 < uVar12 + uVar13) {
    local_c0 = (ulong *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_0017b45e:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar19 = ms->tagTable;
    uVar21 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (uVar25 == 5) {
        uVar26 = *(long *)(local_98 + uVar20) * -0x30e4432345000000;
LAB_0017a83b:
        uVar26 = (uVar26 ^ uVar21) >> (0x38U - cVar6 & 0x3f);
      }
      else {
        if (uVar25 == 6) {
          uVar26 = *(long *)(local_98 + uVar20) * -0x30e4432340650000;
          goto LAB_0017a83b;
        }
        uVar26 = (ulong)((*(int *)(local_98 + uVar20) * -0x61c8864f ^ (uint)uVar21) >>
                        (0x18U - cVar6 & 0x1f));
      }
      uVar23 = ((uint)(uVar26 >> 8) & 0xffffff) << (bVar11 & 0x1f);
      if (((ulong)(pUVar3 + uVar23) & 0x3f) != 0) {
LAB_0017b366:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar19 + uVar23) & ~(-1L << (bVar11 & 0x3f))) != 0) {
LAB_0017b347:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar20 & 7] = (U32)uVar26;
      uVar20 = uVar20 + 1;
    } while (uVar12 + uVar13 != uVar20);
  }
  puVar29 = (ulong *)(srcSize + (long)src);
  if (puVar27 < local_88) {
    local_80 = (ulong *)((long)puVar29 + -7);
    local_70 = (ulong *)((long)puVar29 + -3);
    local_78 = (ulong *)((long)puVar29 + -1);
    local_50 = puVar29 + -4;
    local_38 = ~(-1L << (bVar11 & 0x3f));
    local_c0 = puVar29;
    do {
      local_68 = -(ulong)local_b4;
      if (local_b4 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        if (*(int *)(((long)puVar27 + 1) - (ulong)local_b4) == *(int *)((long)puVar27 + 1)) {
          puVar10 = (ulong *)((long)puVar27 + 5);
          puVar14 = (ulong *)((long)puVar27 + local_68 + 5);
          puVar28 = puVar10;
          if (puVar10 < local_80) {
            uVar21 = *puVar10 ^ *puVar14;
            uVar20 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = uVar20 >> 3 & 0x1fffffff;
            if (*puVar14 == *puVar10) {
              puVar28 = (ulong *)((long)puVar27 + 0xd);
              puVar14 = (ulong *)((long)puVar27 + local_68 + 0xd);
              do {
                if (local_80 <= puVar28) goto LAB_0017a9ee;
                uVar21 = *puVar14;
                uVar26 = *puVar28;
                uVar22 = uVar26 ^ uVar21;
                uVar20 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                uVar20 = (long)puVar28 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar10);
                puVar28 = puVar28 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar21 == uVar26);
            }
          }
          else {
LAB_0017a9ee:
            if ((puVar28 < local_70) && ((int)*puVar14 == (int)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar28 < local_78) && ((short)*puVar14 == (short)*puVar28)) {
              puVar28 = (ulong *)((long)puVar28 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar28 < puVar29) {
              puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar14 == (char)*puVar28));
            }
            uVar20 = (long)puVar28 - (long)puVar10;
          }
          uVar20 = uVar20 + 4;
        }
      }
      local_d0 = 999999999;
      if (uVar25 == 6) {
        if (local_c8 == 6) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
        else if (local_c8 == 5) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
      }
      else if (uVar25 == 5) {
        if (local_c8 == 6) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
        else if (local_c8 == 5) {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
        else {
          uVar21 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
        }
      }
      else if (local_c8 == 6) {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
      }
      else if (local_c8 == 5) {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
      }
      else {
        uVar21 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar27,(BYTE *)puVar29,&local_d0);
      }
      local_b0 = uVar20;
      if (uVar20 < uVar21) {
        local_b0 = uVar21;
      }
      if (local_b0 < 4) {
        uVar20 = (long)puVar27 - (long)src;
        puVar27 = (ulong *)((long)puVar27 + (uVar20 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar20);
        puVar29 = local_c0;
        uVar25 = local_c4;
        uVar23 = local_a8;
        uVar12 = local_b4;
      }
      else {
        puVar10 = puVar27;
        uVar26 = local_d0;
        if (uVar21 <= uVar20) {
          puVar10 = (ulong *)((long)puVar27 + 1);
          uVar26 = 1;
        }
        puVar29 = (ulong *)((long)puVar27 + local_68 + 0xd);
        do {
          if (local_88 <= puVar27) break;
          puVar28 = (ulong *)((long)puVar27 + 1);
          if (((uVar26 != 0) && (local_b4 != 0)) &&
             (*(int *)puVar28 == *(int *)((long)puVar28 + local_68))) {
            puVar14 = (ulong *)((long)puVar27 + 5);
            puVar16 = (ulong *)((long)puVar27 + local_68 + 5);
            puVar9 = puVar14;
            if (puVar14 < local_80) {
              uVar21 = *puVar14 ^ *puVar16;
              uVar20 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar20 = uVar20 >> 3 & 0x1fffffff;
              if (*puVar16 == *puVar14) {
                puVar9 = (ulong *)((long)puVar27 + 0xd);
                puVar16 = puVar29;
                do {
                  if (local_80 <= puVar9) goto LAB_0017abda;
                  uVar21 = *puVar16;
                  uVar22 = *puVar9;
                  uVar24 = uVar22 ^ uVar21;
                  uVar20 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = (long)puVar9 + ((uVar20 >> 3 & 0x1fffffff) - (long)puVar14);
                  puVar9 = puVar9 + 1;
                  puVar16 = puVar16 + 1;
                } while (uVar21 == uVar22);
              }
            }
            else {
LAB_0017abda:
              if ((puVar9 < local_70) && ((int)*puVar16 == (int)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 4);
                puVar16 = (ulong *)((long)puVar16 + 4);
              }
              if ((puVar9 < local_78) && ((short)*puVar16 == (short)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 2);
                puVar16 = (ulong *)((long)puVar16 + 2);
              }
              if (puVar9 < local_c0) {
                puVar9 = (ulong *)((long)puVar9 + (ulong)((char)*puVar16 == (char)*puVar9));
              }
              uVar20 = (long)puVar9 - (long)puVar14;
            }
            if (uVar20 < 0xfffffffffffffffc) {
              uVar13 = 0x1f;
              if ((uint)uVar26 != 0) {
                for (; (uint)uVar26 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              if ((int)((uVar13 ^ 0x1f) + (int)local_b0 * 3 + -0x1e) < (int)(uVar20 + 4) * 3) {
                uVar26 = 1;
                puVar10 = puVar28;
                local_b0 = uVar20 + 4;
              }
            }
          }
          local_d0 = 999999999;
          if (local_c4 == 6) {
            if (local_c8 == 6) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_6
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
            else if (local_c8 == 5) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_5
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
            else {
              uVar20 = ZSTD_RowFindBestMatch_noDict_6_4
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
          }
          else if (local_c4 == 5) {
            if (local_c8 == 6) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_6
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
            else if (local_c8 == 5) {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_5
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
            else {
              uVar20 = ZSTD_RowFindBestMatch_noDict_5_4
                                 (ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0);
            }
          }
          else if (local_c8 == 6) {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0)
            ;
          }
          else if (local_c8 == 5) {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0)
            ;
          }
          else {
            uVar20 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar28,(BYTE *)local_c0,&local_d0)
            ;
          }
          bVar5 = true;
          if (3 < uVar20) {
            uVar13 = 0x1f;
            if ((uint)uVar26 != 0) {
              for (; (uint)uVar26 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            iVar18 = 0x1f;
            if ((uint)local_d0 != 0) {
              for (; (uint)local_d0 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)local_b0 * 4 + -0x1b) < (int)uVar20 * 4 - iVar18) {
              bVar5 = false;
              puVar10 = puVar28;
              uVar26 = local_d0;
              local_b0 = uVar20;
            }
          }
          puVar29 = (ulong *)((long)puVar29 + 1);
          puVar27 = puVar28;
        } while (!bVar5);
        uVar20 = local_b0;
        uVar23 = local_a8;
        uVar13 = local_b4;
        if (3 < uVar26) {
          if ((src < puVar10) && (local_40 < (BYTE *)((long)puVar10 + (3 - uVar26)))) {
            puVar27 = puVar10;
            while (puVar10 = puVar27,
                  *(char *)((long)puVar27 - 1) == *(char *)((long)puVar27 + (2 - uVar26))) {
              puVar10 = (ulong *)((long)puVar27 - 1);
              uVar20 = uVar20 + 1;
              if ((puVar10 <= src) ||
                 (pBVar19 = (BYTE *)((long)puVar27 + (2 - uVar26)), puVar27 = puVar10,
                 pBVar19 <= local_40)) break;
            }
          }
          uVar23 = local_b4;
          uVar13 = (U32)uVar26 - 3;
        }
        if (local_a0->maxNbSeq <=
            (ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart >> 3)) {
LAB_0017b401:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_b0 = uVar20;
        if (0x20000 < local_a0->maxNbLit) {
LAB_0017b3c3:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)puVar10 - (long)src;
        puVar27 = (ulong *)local_a0->lit;
        if (local_a0->litStart + local_a0->maxNbLit < (BYTE *)((long)puVar27 + uVar20)) {
LAB_0017b3a4:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c0 < puVar10) {
LAB_0017b385:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar10) {
          ZSTD_safecopyLiterals((BYTE *)puVar27,(BYTE *)src,(BYTE *)puVar10,(BYTE *)local_50);
        }
        else {
          uVar21 = *(ulong *)((long)src + 8);
          *puVar27 = *src;
          puVar27[1] = uVar21;
          if (0x10 < uVar20) {
            pBVar19 = local_a0->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar19 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar21 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar19 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar19 + 0x18) = uVar21;
            if (0x20 < (long)uVar20) {
              lVar17 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar17 + 0x20);
                uVar7 = puVar2[1];
                pBVar1 = pBVar19 + lVar17 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar7;
                puVar2 = (undefined8 *)((long)src + lVar17 + 0x30);
                uVar7 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar7;
                lVar17 = lVar17 + 0x20;
              } while (pBVar1 + 0x20 < pBVar19 + uVar20);
            }
          }
        }
        puVar29 = local_c0;
        local_a0->lit = local_a0->lit + uVar20;
        if (0xffff < uVar20) {
          if (local_a0->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a0->longLengthType = ZSTD_llt_literalLength;
          local_a0->longLengthPos =
               (U32)((ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart) >> 3);
        }
        psVar4 = local_a0->sequences;
        psVar4->litLength = (U16)uVar20;
        psVar4->offBase = (U32)uVar26;
        if (local_b0 < 3) {
LAB_0017b3e2:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < local_b0 - 3) {
          if (local_a0->longLengthType != ZSTD_llt_none) {
LAB_0017b420:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a0->longLengthType = ZSTD_llt_matchLength;
          local_a0->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_a0->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(local_b0 - 3);
        local_a0->sequences = psVar4 + 1;
        if (local_90->lazySkipping != 0) {
          uVar25 = local_90->nextToUpdate;
          uVar20 = (ulong)uVar25;
          uVar12 = ((int)local_88 - (int)(local_98 + uVar20)) + 1;
          if (7 < uVar12) {
            uVar12 = 8;
          }
          if (local_88 < local_98 + uVar20) {
            uVar12 = 0;
          }
          if (uVar25 < uVar12 + uVar25) {
            if (0x20 < local_90->rowHashLog + 8) goto LAB_0017b45e;
            pUVar3 = local_90->hashTable;
            pBVar19 = local_90->tagTable;
            uVar21 = local_90->hashSalt;
            cVar6 = (char)local_90->rowHashLog;
            do {
              if (local_c4 == 5) {
                uVar26 = *(long *)(local_98 + uVar20) * -0x30e4432345000000;
LAB_0017b01a:
                uVar26 = (uVar26 ^ uVar21) >> (0x38U - cVar6 & 0x3f);
              }
              else {
                if (local_c4 == 6) {
                  uVar26 = *(long *)(local_98 + uVar20) * -0x30e4432340650000;
                  goto LAB_0017b01a;
                }
                uVar26 = (ulong)((*(int *)(local_98 + uVar20) * -0x61c8864f ^ (uint)uVar21) >>
                                (0x18U - cVar6 & 0x1f));
              }
              uVar15 = ((uint)(uVar26 >> 8) & 0xffffff) << ((byte)local_c8 & 0x1f);
              if (((ulong)(pUVar3 + uVar15) & 0x3f) != 0) goto LAB_0017b366;
              if ((local_38 & (ulong)(pBVar19 + uVar15)) != 0) goto LAB_0017b347;
              local_90->hashCache[(uint)uVar20 & 7] = (U32)uVar26;
              uVar20 = uVar20 + 1;
            } while (uVar12 + uVar25 != uVar20);
          }
          local_90->lazySkipping = 0;
        }
        puVar27 = (ulong *)((long)puVar10 + local_b0);
        ms = local_90;
        src = puVar27;
        uVar25 = local_c4;
        uVar12 = uVar13;
        if ((uVar23 != 0) && (puVar27 <= local_88)) {
          while (uVar15 = uVar23, psVar8 = local_a0, uVar20 = (ulong)uVar15, ms = local_90,
                src = puVar27, uVar23 = uVar15, uVar12 = uVar13,
                (int)*puVar27 == *(int *)((long)puVar27 - uVar20)) {
            puVar10 = (ulong *)((long)puVar27 + 4);
            puVar14 = (ulong *)((long)puVar27 + (4 - uVar20));
            puVar28 = puVar10;
            if (puVar10 < local_80) {
              uVar26 = *puVar10 ^ *puVar14;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
              if (*puVar14 == *puVar10) {
                puVar28 = (ulong *)((long)puVar27 + 0xc);
                puVar14 = (ulong *)((long)puVar27 + (0xc - uVar20));
                do {
                  if (local_80 <= puVar28) goto LAB_0017b16a;
                  uVar20 = *puVar14;
                  uVar26 = *puVar28;
                  uVar22 = uVar26 ^ uVar20;
                  uVar21 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                    }
                  }
                  uVar21 = (long)puVar28 + ((uVar21 >> 3 & 0x1fffffff) - (long)puVar10);
                  puVar28 = puVar28 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar20 == uVar26);
              }
            }
            else {
LAB_0017b16a:
              if ((puVar28 < local_70) && ((int)*puVar14 == (int)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 4);
                puVar14 = (ulong *)((long)puVar14 + 4);
              }
              if ((puVar28 < local_78) && ((short)*puVar14 == (short)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 2);
                puVar14 = (ulong *)((long)puVar14 + 2);
              }
              if (puVar28 < puVar29) {
                puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar14 == (char)*puVar28));
              }
              uVar21 = (long)puVar28 - (long)puVar10;
            }
            if (local_a0->maxNbSeq <=
                (ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart >> 3))
            goto LAB_0017b401;
            if (0x20000 < local_a0->maxNbLit) goto LAB_0017b3c3;
            puVar10 = (ulong *)local_a0->lit;
            if (local_a0->litStart + local_a0->maxNbLit < puVar10) goto LAB_0017b3a4;
            if (puVar29 < puVar27) goto LAB_0017b385;
            if (local_50 < puVar27) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar10,(BYTE *)puVar27,(BYTE *)puVar27,(BYTE *)local_50);
              uVar25 = local_c4;
            }
            else {
              uVar20 = puVar27[1];
              *puVar10 = *puVar27;
              puVar10[1] = uVar20;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (uVar21 + 4 < 3) goto LAB_0017b3e2;
            if (0xffff < uVar21 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_0017b420;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(uVar21 + 1);
            psVar8->sequences = psVar4 + 1;
            puVar27 = (ulong *)((long)puVar27 + uVar21 + 4);
            ms = local_90;
            src = puVar27;
            uVar23 = uVar13;
            uVar12 = uVar15;
            if ((uVar13 == 0) || (uVar13 = uVar15, local_88 < puVar27)) break;
          }
        }
      }
      local_b4 = uVar12;
      local_a8 = uVar23;
    } while (puVar27 < local_88);
  }
  if (local_5c <= local_54) {
    local_5c = 0;
  }
  uVar13 = local_5c;
  if (local_b4 != 0) {
    uVar13 = local_58;
  }
  if (local_58 <= local_54) {
    uVar13 = local_5c;
    local_58 = 0;
  }
  if (local_b4 != 0) {
    local_58 = local_b4;
  }
  if (local_a8 != 0) {
    uVar13 = local_a8;
  }
  *local_48 = local_58;
  local_48[1] = uVar13;
  return (long)puVar29 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}